

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

bool bssl::anon_unknown_0::MakeECHConfig
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *out,ECHConfigParams *params)

{
  EVP_HPKE_KEY *key;
  bool bVar1;
  int iVar2;
  EVP_HPKE_KEM *kem;
  cbb_st *pcVar3;
  uchar *puVar4;
  size_type sVar5;
  reference puVar6;
  uint8_t *puVar7;
  size_t sVar8;
  uint8_t *puVar9;
  uint16_t local_10c;
  const_iterator cStack_108;
  uint16_t cipher_suite;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *__range2;
  CBB child;
  CBB contents;
  ScopedCBB cbb;
  size_type local_58;
  size_t len;
  undefined1 local_40 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> public_key;
  uint16_t kem_id;
  ECHConfigParams *params_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *out_local;
  
  if (params->kem_id == 0) {
    kem = EVP_HPKE_KEY_kem(params->key);
    local_10c = EVP_HPKE_KEM_id(kem);
  }
  else {
    local_10c = params->kem_id;
  }
  public_key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_2_ = local_10c;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,&params->public_key);
  bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  if (bVar1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,0x41);
    key = params->key;
    puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
    sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
    iVar2 = EVP_HPKE_KEY_public_key(key,puVar4,&local_58,sVar5);
    if (iVar2 == 0) {
      out_local._7_1_ = false;
      goto LAB_00183e93;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,local_58);
  }
  internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::StackAllocated
            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)((long)&contents.u + 0x18));
  pcVar3 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                     ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                      ((long)&contents.u + 0x18));
  iVar2 = CBB_init(pcVar3,0x40);
  if (iVar2 == 0) {
LAB_00183b9f:
    out_local._7_1_ = false;
  }
  else {
    pcVar3 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                       ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                        ((long)&contents.u + 0x18));
    iVar2 = CBB_add_u16(pcVar3,params->version);
    if (iVar2 == 0) goto LAB_00183b9f;
    pcVar3 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                       ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                        ((long)&contents.u + 0x18));
    iVar2 = CBB_add_u16_length_prefixed(pcVar3,(CBB *)((long)&child.u + 0x18));
    if ((((iVar2 == 0) ||
         (iVar2 = CBB_add_u8((CBB *)((long)&child.u + 0x18),(uint8_t)params->config_id), iVar2 == 0)
         ) || (iVar2 = CBB_add_u16((CBB *)((long)&child.u + 0x18),
                                   public_key.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._6_2_),
              iVar2 == 0)) ||
       (iVar2 = CBB_add_u16_length_prefixed((CBB *)((long)&child.u + 0x18),(CBB *)&__range2),
       iVar2 == 0)) goto LAB_00183b9f;
    puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
    sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
    iVar2 = CBB_add_bytes((CBB *)&__range2,puVar4,sVar5);
    if ((iVar2 == 0) ||
       (iVar2 = CBB_add_u16_length_prefixed((CBB *)((long)&child.u + 0x18),(CBB *)&__range2),
       iVar2 == 0)) goto LAB_00183b9f;
    __end2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin
                       (&params->cipher_suites);
    cStack_108 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end
                           (&params->cipher_suites);
    while (bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xfffffffffffffef8), bVar1) {
      puVar6 = __gnu_cxx::
               __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
               ::operator*(&__end2);
      iVar2 = CBB_add_u16((CBB *)&__range2,*puVar6);
      if (iVar2 == 0) {
        out_local._7_1_ = false;
        goto LAB_00183e87;
      }
      __gnu_cxx::
      __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
      ::operator++(&__end2);
    }
    iVar2 = CBB_add_u8((CBB *)((long)&child.u + 0x18),(uint8_t)params->max_name_len);
    if ((iVar2 == 0) ||
       (iVar2 = CBB_add_u8_length_prefixed((CBB *)((long)&child.u + 0x18),(CBB *)&__range2),
       iVar2 == 0)) {
LAB_00183dbd:
      out_local._7_1_ = false;
    }
    else {
      puVar7 = (uint8_t *)std::__cxx11::string::data();
      sVar8 = std::__cxx11::string::size();
      iVar2 = CBB_add_bytes((CBB *)&__range2,puVar7,sVar8);
      if ((iVar2 == 0) ||
         (iVar2 = CBB_add_u16_length_prefixed((CBB *)((long)&child.u + 0x18),(CBB *)&__range2),
         iVar2 == 0)) goto LAB_00183dbd;
      puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&params->extensions)
      ;
      sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&params->extensions);
      iVar2 = CBB_add_bytes((CBB *)&__range2,puVar4,sVar5);
      if (iVar2 == 0) goto LAB_00183dbd;
      pcVar3 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                         ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                          ((long)&contents.u + 0x18));
      iVar2 = CBB_flush(pcVar3);
      if (iVar2 == 0) goto LAB_00183dbd;
      pcVar3 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                         ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                          ((long)&contents.u + 0x18));
      puVar7 = CBB_data(pcVar3);
      pcVar3 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                         ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                          ((long)&contents.u + 0x18));
      puVar9 = CBB_data(pcVar3);
      pcVar3 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                         ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                          ((long)&contents.u + 0x18));
      sVar8 = CBB_len(pcVar3);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::assign<unsigned_char_const*,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)out,puVar7,puVar9 + sVar8);
      out_local._7_1_ = true;
    }
  }
LAB_00183e87:
  internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)((long)&contents.u + 0x18));
LAB_00183e93:
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  return out_local._7_1_;
}

Assistant:

bool MakeECHConfig(std::vector<uint8_t> *out, const ECHConfigParams &params) {
  uint16_t kem_id = params.kem_id == 0
                        ? EVP_HPKE_KEM_id(EVP_HPKE_KEY_kem(params.key))
                        : params.kem_id;
  std::vector<uint8_t> public_key = params.public_key;
  if (public_key.empty()) {
    public_key.resize(EVP_HPKE_MAX_PUBLIC_KEY_LENGTH);
    size_t len;
    if (!EVP_HPKE_KEY_public_key(params.key, public_key.data(), &len,
                                 public_key.size())) {
      return false;
    }
    public_key.resize(len);
  }

  bssl::ScopedCBB cbb;
  CBB contents, child;
  if (!CBB_init(cbb.get(), 64) ||                                      //
      !CBB_add_u16(cbb.get(), params.version) ||                       //
      !CBB_add_u16_length_prefixed(cbb.get(), &contents) ||            //
      !CBB_add_u8(&contents, params.config_id) ||                      //
      !CBB_add_u16(&contents, kem_id) ||                               //
      !CBB_add_u16_length_prefixed(&contents, &child) ||               //
      !CBB_add_bytes(&child, public_key.data(), public_key.size()) ||  //
      !CBB_add_u16_length_prefixed(&contents, &child)) {
    return false;
  }
  for (uint16_t cipher_suite : params.cipher_suites) {
    if (!CBB_add_u16(&child, cipher_suite)) {
      return false;
    }
  }
  if (!CBB_add_u8(&contents, params.max_name_len) ||
      !CBB_add_u8_length_prefixed(&contents, &child) ||
      !CBB_add_bytes(
          &child, reinterpret_cast<const uint8_t *>(params.public_name.data()),
          params.public_name.size()) ||
      !CBB_add_u16_length_prefixed(&contents, &child) ||
      !CBB_add_bytes(&child, params.extensions.data(),
                     params.extensions.size()) ||
      !CBB_flush(cbb.get())) {
    return false;
  }

  out->assign(CBB_data(cbb.get()), CBB_data(cbb.get()) + CBB_len(cbb.get()));
  return true;
}